

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::parse(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
        *this,item_event_visitor *visitor,error_code *ec)

{
  ulong uVar1;
  char_result<unsigned_char> cVar2;
  reference pvVar3;
  size_type sVar4;
  assertion_error *this_00;
  allocator<char> *in_RDI;
  char_result<unsigned_char> c_1;
  char_result<unsigned_char> c;
  error_code *in_stack_00000170;
  item_event_visitor *in_stack_00000178;
  basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  *in_stack_00000180;
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff68;
  error_code *in_stack_ffffffffffffff70;
  item_event_visitor *in_stack_ffffffffffffff78;
  basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  allocator<char> local_61;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  uchar local_1c;
  uchar local_1a;
  
  while( true ) {
    local_61 = (allocator<char>)0x0;
    if (((byte)in_RDI[9] & 1) == 0) {
      local_61 = in_RDI[8];
    }
    if (((byte)local_61 & 1) == 0) break;
    pvVar3 = std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
             ::back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
    switch(pvVar3->mode) {
    case root:
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      pvVar3->mode = accept;
      read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      break;
    case accept:
      sVar4 = std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
              ::size((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                      *)(in_RDI + 0xb8));
      if (sVar4 != 1) {
        uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
        this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffb0,(char *)CONCAT44(in_stack_ffffffffffffffac,uVar5),
                   in_RDI);
        assertion_error::assertion_error(this_00,(string *)in_stack_ffffffffffffff68);
        __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
      }
      std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::clear
                ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                  *)0x348594);
      in_RDI[8] = (allocator<char>)0x0;
      in_RDI[9] = (allocator<char>)0x1;
      basic_item_event_visitor<char>::flush((basic_item_event_visitor<char> *)0x3485ae);
      break;
    case array:
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      uVar1 = pvVar3->index;
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      if (uVar1 < pvVar3->length) {
        pvVar3 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar3->index = pvVar3->index + 1;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      else {
        end_array(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      break;
    case indefinite_array:
      cVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::peek(in_stack_ffffffffffffff68);
      if (((ushort)cVar2 & 0x100) != 0) {
        std::error_code::operator=
                  ((error_code *)in_stack_ffffffffffffff80,
                   (cbor_errc)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        in_RDI[8] = (allocator<char>)0x0;
        return;
      }
      local_1a = cVar2.value;
      if (local_1a == 0xff) {
        binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::ignore((binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
        end_array(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      break;
    case map_key:
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff80 =
           (basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
            *)pvVar3->index;
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      if (in_stack_ffffffffffffff80 <
          (basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
           *)pvVar3->length) {
        pvVar3 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar3->index = pvVar3->index + 1;
        pvVar3 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar3->mode = map_value;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      else {
        end_object(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      break;
    case map_value:
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      pvVar3->mode = map_key;
      read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      break;
    case indefinite_map_key:
      cVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::peek(in_stack_ffffffffffffff68);
      if (((ushort)cVar2 & 0x100) != 0) {
        std::error_code::operator=
                  ((error_code *)in_stack_ffffffffffffff80,
                   (cbor_errc)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        in_RDI[8] = (allocator<char>)0x0;
        return;
      }
      local_1c = cVar2.value;
      if (local_1c == 0xff) {
        binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::ignore((binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
        end_object(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        pvVar3 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar3->mode = indefinite_map_value;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      break;
    case indefinite_map_value:
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      pvVar3->mode = indefinite_map_key;
      read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      break;
    case multi_dim:
      pvVar3 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      if (pvVar3->index == 0) {
        pvVar3 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar3->index = pvVar3->index + 1;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      else {
        produce_end_multi_dim
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
    }
  }
  return;
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::multi_dim:
                {
                    if (state_stack_.back().index == 0)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        produce_end_multi_dim(visitor, ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_array:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_array(visitor, ec);
                    }
                    else
                    {
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::indefinite_map_key:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_object(visitor, ec);
                    }
                    else
                    {
                        state_stack_.back().mode = parse_mode::indefinite_map_value;
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_map_value:
                {
                    state_stack_.back().mode = parse_mode::indefinite_map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }